

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch.c
# Opt level: O2

int pnga_sprs_array_num_nonzeros(Integer g_a)

{
  float fVar1;
  int iVar2;
  int extraout_EAX;
  Integer proc;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  void *ptr;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  long local_80;
  long local_78;
  Integer local_70;
  long local_68;
  Integer local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  local_80 = 0;
  lVar6 = g_a + 1000;
  iVar2 = GA[lVar6].type;
  proc = pnga_pgroup_nodeid((long)GA[lVar6].p_handle);
  local_70 = pnga_pgroup_nnodes((long)GA[lVar6].p_handle);
  local_68 = lVar6 * 0x368;
  if ((long)GA[lVar6].ndim != 2) {
    pnga_error("Array must be 2 dimensional",(long)GA[lVar6].ndim);
  }
  pnga_distribution(g_a,proc,&local_48,&local_58);
  pnga_access_ptr(g_a,&local_48,&local_58,&local_78,&local_60);
  if (iVar2 - 0x3e9U < 0x10) {
    lVar6 = ((local_50 - local_40) + 1) * ((local_58 - local_48) + 1);
    switch(iVar2) {
    case 0x3e9:
      local_80 = 0;
      if (lVar6 < 1) {
        lVar6 = local_80;
      }
      for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
        local_80 = (local_80 + 1) - (ulong)(*(int *)(local_78 + lVar5 * 4) == 0);
      }
      break;
    case 0x3ea:
      lVar5 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar5;
      }
      for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
        if (*(long *)(local_78 + lVar4 * 8) != 0) {
          lVar5 = lVar5 + 1;
          local_80 = lVar5;
        }
      }
      break;
    case 0x3eb:
      local_80 = 0;
      if (lVar6 < 1) {
        lVar6 = local_80;
      }
      for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
        local_80 = local_80 + (ulong)(-(uint)(*(float *)(local_78 + lVar5 * 4) != 0.0) & 1);
      }
      break;
    case 0x3ec:
      local_80 = 0;
      if (lVar6 < 1) {
        lVar6 = local_80;
      }
      for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
        local_80 = local_80 + (ulong)(*(double *)(local_78 + lVar5 * 8) != 0.0);
      }
      break;
    case 0x3ee:
      local_80 = 0;
      if (lVar6 < 1) {
        lVar6 = local_80;
      }
      for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
        fVar1 = *(float *)(local_78 + lVar5 * 8);
        if (((fVar1 != 0.0) || (NAN(fVar1))) ||
           ((fVar1 = *(float *)(local_78 + 4 + lVar5 * 8), fVar1 != 0.0 || (NAN(fVar1))))) {
          local_80 = local_80 + 1;
        }
      }
      break;
    case 0x3ef:
      local_80 = 0;
      if (lVar6 < 1) {
        lVar6 = local_80;
      }
      pdVar3 = (double *)(local_78 + 8);
      while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
        if ((((pdVar3[-1] != 0.0) || (NAN(pdVar3[-1]))) || (*pdVar3 != 0.0)) || (NAN(*pdVar3))) {
          local_80 = local_80 + 1;
        }
        pdVar3 = pdVar3 + 2;
      }
      break;
    case 0x3f8:
      local_80 = 0;
      if (lVar6 < 1) {
        lVar6 = local_80;
      }
      for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
        local_80 = (local_80 + 1) - (ulong)(*(long *)(local_78 + lVar5 * 8) == 0);
      }
    }
  }
  pnga_pgroup_gop((long)*(int *)((long)GA->block_dims + local_68 + -0x18),(long)iVar2,&local_80,
                  local_70,"+");
  return extraout_EAX;
}

Assistant:

int pnga_sprs_array_num_nonzeros(Integer g_a)
{
  Integer cnt = 0;
  void *ptr;
  Integer lo[2], hi[2], ld;
  Integer handle = g_a + GA_OFFSET;
  Integer type = GA[handle].type;
  Integer me = pnga_pgroup_nodeid(GA[handle].p_handle);
  Integer nprocs = pnga_pgroup_nnodes(GA[handle].p_handle);
  Integer nelem;
  Integer i;

  if (GA[handle].ndim != 2)
    pnga_error("Array must be 2 dimensional",GA[handle].ndim);
  pnga_distribution(g_a,me,lo,hi);
  nelem = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
  pnga_access_ptr(g_a,lo,hi,&ptr,&ld);
  if (type == C_INT) {
    int *iptr = (int*)ptr;
    for (i=0; i<nelem; i++) {
      if (iptr[i] != 0) cnt++;
    }
  } else if (type == C_LONG) {
    long *lptr = (long*)ptr;
    for (i=0; i<nelem; i++) {
      if (lptr[i] != 0) cnt++;
    }
  } else if (type == C_LONGLONG) {
    long long *llptr = (long long*)ptr;
    for (i=0; i<nelem; i++) {
      if (llptr[i] != 0) cnt++;
    }
  } else if (type == C_FLOAT) {
    float *fptr = (float*)ptr;
    for (i=0; i<nelem; i++) {
      if (fptr[i] != 0.0) cnt++;
    }
  } else if (type == C_DBL) {
    double *dptr = (double*)ptr;
    for (i=0; i<nelem; i++) {
      if (dptr[i] != 0.0) cnt++;
    }
  } else if (type == C_SCPL) {
    float *fptr = (float*)ptr;
    for (i=0; i<nelem; i++) {
      if (fptr[2*i] != 0.0 || fptr[2*i+1] != 0.0) cnt++;
    }
  } else if (type == C_DCPL) {
    double *dptr = (double*)ptr;
    for (i=0; i<nelem; i++) {
      if (dptr[2*i] != 0.0 || dptr[2*i+1] != 0.0) cnt++;
    }
  }
  pnga_pgroup_gop(GA[handle].p_handle,type,&cnt,nprocs,"+");
}